

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::~ImplicitProducer(ImplicitProducer *this)

{
  ulong uVar1;
  ulong uVar2;
  Block *node;
  BlockIndexHeader *pBVar3;
  __pointer_type __ptr;
  BlockIndexEntry *pBVar4;
  __pointer_type node_00;
  ulong index;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ImplicitProducer_00181960;
  uVar1 = (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  uVar2 = (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i;
  if (uVar2 != uVar1 && uVar2 - uVar1 < 0x8000000000000001) {
    __assert_fail("index == tail || details::circular_less_than(index, tail)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                  ,0x937,
                  "virtual moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::~ImplicitProducer() [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                 );
  }
  node_00 = (Block *)0x0;
  for (index = uVar2; uVar1 != index; index = index + 1) {
    if (node_00 == (Block *)0x0 || (index & 0x1f) == 0) {
      if (node_00 != (Block *)0x0) {
        FreeList<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
        ::add(&((this->super_ProducerBase).parent)->freeList,node_00);
      }
      pBVar4 = get_block_index_entry_for_index(this,index);
      node_00 = (pBVar4->value)._M_b._M_p;
    }
  }
  node = (this->super_ProducerBase).tailBlock;
  if ((node != (Block *)0x0) && ((uVar1 & 0x1f) != 0 || uVar2 != uVar1)) {
    FreeList<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
    ::add(&((this->super_ProducerBase).parent)->freeList,node);
  }
  __ptr = (this->blockIndex)._M_b._M_p;
  while (__ptr != (__pointer_type)0x0) {
    pBVar3 = __ptr->prev;
    free(__ptr);
    __ptr = pBVar3;
  }
  return;
}

Assistant:

~ImplicitProducer()
		{
			// Note that since we're in the destructor we can assume that all enqueue/dequeue operations
			// completed already; this means that all undequeued elements are placed contiguously across
			// contiguous blocks, and that only the first and last remaining blocks can be only partially
			// empty (all other remaining blocks must be completely full).
			
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
			// Unregister ourselves for thread termination notification
			if (!this->inactive.load(std::memory_order_relaxed)) {
				details::ThreadExitNotifier::unsubscribe(&threadExitListener);
			}
#endif
			
			// Destroy all remaining elements!
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto index = this->headIndex.load(std::memory_order_relaxed);
			Block* block = nullptr;
			assert(index == tail || details::circular_less_than(index, tail));
			bool forceFreeLastBlock = index != tail;		// If we enter the loop, then the last (tail) block will not be freed
			while (index != tail) {
				if ((index & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 || block == nullptr) {
					if (block != nullptr) {
						// Free the old block
						this->parent->add_block_to_free_list(block);
					}
					
					block = get_block_index_entry_for_index(index)->value.load(std::memory_order_relaxed);
				}
				
				((*block)[index])->~T();
				++index;
			}
			// Even if the queue is empty, there's still one block that's not on the free list
			// (unless the head index reached the end of it, in which case the tail will be poised
			// to create a new block).
			if (this->tailBlock != nullptr && (forceFreeLastBlock || (tail & static_cast<index_t>(BLOCK_SIZE - 1)) != 0)) {
				this->parent->add_block_to_free_list(this->tailBlock);
			}
			
			// Destroy block index
			auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);
			if (localBlockIndex != nullptr) {
				for (size_t i = 0; i != localBlockIndex->capacity; ++i) {
					localBlockIndex->index[i]->~BlockIndexEntry();
				}
				do {
					auto prev = localBlockIndex->prev;
					localBlockIndex->~BlockIndexHeader();
					(Traits::free)(localBlockIndex);
					localBlockIndex = prev;
				} while (localBlockIndex != nullptr);
			}
		}